

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.h
# Opt level: O3

void __thiscall
cert::DynamicArray<cert::Material_*>::push_back
          (DynamicArray<cert::Material_*> *this,Material *value)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = this->m_size;
  uVar2 = uVar1;
  if (this->m_allocated <= uVar1) {
    reserve(this,this->m_allocated * 2);
    uVar2 = this->m_size;
  }
  this->m_data[(int)uVar1] = value;
  this->m_size = uVar2 + 1;
  return;
}

Assistant:

constexpr void push_back (T value)
	{
		int new_val_index = m_size;
		if (m_size >= m_allocated)
		{
			reserve (2 * m_allocated);
		}
		m_data[new_val_index] = value;
		m_size++;
	}